

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdSubtract(EpDouble *epd1,double value)

{
  int iVar1;
  int __exponent;
  double dVar2;
  EpType val_1;
  EpDouble epd2;
  EpTypeUnion local_58;
  int local_50;
  double local_48;
  undefined8 uStack_40;
  EpTypeUnion local_30;
  
  dVar2 = (epd1->type).value;
  if (((uint)((ulong)dVar2 >> 0x34) < 0xfff || ((ulong)dVar2 & 0xfffffffffffff) != 0x8000000000000)
     && (((ulong)value & 0xfffffffffffff) != 0x8000000000000 || (ulong)value < 0xfff0000000000000))
  {
    if (ABS(dVar2) == INFINITY) {
      EpdConvert(value,(EpDouble *)&local_58.bits);
      if (ABS(value) == INFINITY) {
        if ((long)((ulong)dVar2 ^ (ulong)local_58) < 0) {
          return;
        }
        goto LAB_00687fe4;
      }
    }
    else {
      if (ABS(value) != INFINITY) {
        uStack_40 = 0;
        local_48 = dVar2;
        if (((ulong)dVar2 & 0x7ff0000000000000) == 0x3ff0000000000000) {
          EpdConvert(value,(EpDouble *)&local_58.bits);
          iVar1 = epd1->exponent;
          __exponent = iVar1 - local_50;
          if (__exponent == 0 || iVar1 < local_50) {
            if (iVar1 < local_50) {
              if (local_50 - iVar1 < 0x400) {
                dVar2 = ldexp(1.0,local_50 - iVar1);
                iVar1 = local_50;
                dVar2 = local_48 / dVar2 - local_58.value;
              }
              else {
                iVar1 = local_50;
                dVar2 = -local_58.value;
              }
            }
            else {
              dVar2 = local_48 - local_58.value;
            }
          }
          else {
            dVar2 = local_48;
            if (__exponent < 0x400) {
              local_30.value = local_58.value;
              dVar2 = ldexp(1.0,__exponent);
              iVar1 = epd1->exponent;
              dVar2 = local_48 - local_30.value / dVar2;
            }
          }
          (epd1->type).value = dVar2;
          epd1->exponent = iVar1;
          EpdNormalize(epd1);
          return;
        }
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/epd/epd.c"
                      ,0x2ed,"void EpdSubtract(EpDouble *, double)");
      }
      EpdConvert(value,(EpDouble *)&local_58.bits);
    }
    if (ABS(local_58.value) == INFINITY) {
      (epd1->type).value = (double)local_58;
      epd1->exponent = local_50;
    }
  }
  else {
LAB_00687fe4:
    (epd1->type).value = -NAN;
    epd1->exponent = 0;
  }
  return;
}

Assistant:

void
EpdSubtract(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent, diff;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    if (EpdIsInf(epd1) && IsInfDouble(value)) {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(&epd2)) {
      EpdCopy(&epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  if (epd1->exponent > epd2.exponent) {
    diff = epd1->exponent - epd2.exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value - epd2.type.value / pow((double)2.0, (double)diff);
    else
      tmp = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2.exponent) {
    diff = epd2.exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value / pow((double)2.0, (double)diff) - epd2.type.value;
    else
      tmp = epd2.type.value * (double)(-1.0);
    exponent = epd2.exponent;
  } else {
    tmp = epd1->type.value - epd2.type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}